

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformBlockTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::createBlockBasicTypeCases
               (TestCaseGroup *group,Context *context,char *name,VarType *type,deUint32 layoutFlags,
               int numInstances)

{
  VarType *pVVar1;
  char *pcVar2;
  Context *pCVar3;
  TestNode *pTVar4;
  char *pcVar5;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_ca;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_85;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  deUint32 local_2c;
  int numInstances_local;
  deUint32 layoutFlags_local;
  VarType *type_local;
  char *name_local;
  Context *context_local;
  TestCaseGroup *group_local;
  
  local_30 = numInstances;
  local_2c = layoutFlags;
  _numInstances_local = type;
  type_local = (VarType *)name;
  name_local = (char *)context;
  context_local = (Context *)group;
  pTVar4 = (TestNode *)operator_new(0xb0);
  pcVar2 = name_local;
  pVVar1 = type_local;
  local_85 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,(char *)pVVar1,&local_71);
  std::operator+(&local_50,&local_70,"_vertex");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar4,(Context *)pcVar2,pcVar5,"",_numInstances_local,
             local_2c | 0x100,local_30);
  local_85 = 0;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar4);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pCVar3 = context_local;
  pTVar4 = (TestNode *)operator_new(0xb0);
  pcVar2 = name_local;
  pVVar1 = type_local;
  local_ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,(char *)pVVar1,&local_c9);
  std::operator+(&local_a8,&local_c8,"_fragment");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar4,(Context *)pcVar2,pcVar5,"",_numInstances_local,
             local_2c | 0x200,local_30);
  local_ca = 0;
  tcu::TestNode::addChild((TestNode *)pCVar3,pTVar4);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pCVar3 = context_local;
  if ((local_2c & 0x10) == 0) {
    pTVar4 = (TestNode *)operator_new(0xb0);
    pcVar2 = name_local;
    pVVar1 = type_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,(char *)pVVar1,&local_111);
    std::operator+(&local_f0,&local_110,"_both");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    BlockBasicTypeCase::BlockBasicTypeCase
              ((BlockBasicTypeCase *)pTVar4,(Context *)pcVar2,pcVar5,"",_numInstances_local,
               local_2c | 0x300,local_30);
    tcu::TestNode::addChild((TestNode *)pCVar3,pTVar4);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  return;
}

Assistant:

static void createBlockBasicTypeCases (tcu::TestCaseGroup* group, Context& context, const char* name, const VarType& type, deUint32 layoutFlags, int numInstances = 0)
{
	group->addChild(new BlockBasicTypeCase(context, (string(name) + "_vertex").c_str(),		"", type, layoutFlags|DECLARE_VERTEX,					numInstances));
	group->addChild(new BlockBasicTypeCase(context, (string(name) + "_fragment").c_str(),	"", type, layoutFlags|DECLARE_FRAGMENT,					numInstances));

	if (!(layoutFlags & LAYOUT_PACKED))
		group->addChild(new BlockBasicTypeCase(context, (string(name) + "_both").c_str(),	"", type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	numInstances));
}